

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_serialize_field
          (t_cpp_generator *this,ostream *out,t_field *tfield,string *prefix,string *suffix)

{
  int iVar1;
  t_struct *tstruct;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  string *this_00;
  t_base_type *this_01;
  undefined1 auVar5 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(tfield->type_);
  std::operator+(&local_b0,prefix,&tfield->name_);
  std::operator+(&name,&local_b0,suffix);
  std::__cxx11::string::~string((string *)&local_b0);
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar1 != '\0') {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar3,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",&name);
    __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar1 == '\0')
     ) {
    iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if (((char)iVar1 != '\0') ||
         (iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct),
         (char)iVar1 != '\0')) {
        poVar2 = t_generator::indent((t_generator *)this,out);
        std::operator<<(poVar2,"xfer += oprot->");
        iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
          if ((char)iVar1 != '\0') {
            poVar2 = std::operator<<(out,"writeI32(static_cast<int32_t>(");
            poVar2 = std::operator<<(poVar2,(string *)&name);
            std::operator<<(poVar2,"));");
          }
        }
        else {
          this_01 = (t_base_type *)
                    (ulong)*(uint *)&(tstruct->members_).
                                     super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
          switch(this_01) {
          case (t_base_type *)0x0:
            pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar3,"compiler error: cannot serialize void field in a struct: ",&name)
            ;
            __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case (t_base_type *)0x1:
            iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
            pcVar4 = "writeString(";
            if ((char)iVar1 != '\0') {
              pcVar4 = "writeBinary(";
            }
            break;
          case (t_base_type *)0x2:
            pcVar4 = "writeBool(";
            break;
          case (t_base_type *)0x3:
            pcVar4 = "writeByte(";
            break;
          case (t_base_type *)0x4:
            pcVar4 = "writeI16(";
            break;
          case (t_base_type *)0x5:
            pcVar4 = "writeI32(";
            break;
          case (t_base_type *)0x6:
            pcVar4 = "writeI64(";
            break;
          case (t_base_type *)0x7:
            pcVar4 = "writeDouble(";
            break;
          default:
            auVar5 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_(&local_50,this_01,auVar5._8_4_);
            std::operator+(&local_b0,"compiler error: no C++ writer for base type ",&local_50);
            std::operator+(auVar5._0_8_,&local_b0,&name);
            __cxa_throw(auVar5._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          poVar2 = std::operator<<(out,pcVar4);
          poVar2 = std::operator<<(poVar2,(string *)&name);
          std::operator<<(poVar2,");");
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
        goto LAB_001734a8;
      }
      type_name_abi_cxx11_(&local_b0,this,(t_type *)tstruct,false,false);
      this_00 = &local_b0;
      printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s\' TYPE \'%s\'\n",name._M_dataplus._M_p,
             local_b0._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::string((string *)&local_90,(string *)&name);
      generate_serialize_container(this,out,(t_type *)tstruct,&local_90);
      this_00 = &local_90;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_70,(string *)&name);
    generate_serialize_struct(this,out,tstruct,&local_70,tfield->reference_);
    this_00 = &local_70;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001734a8:
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_cpp_generator::generate_serialize_field(ostream& out,
                                               t_field* tfield,
                                               string prefix,
                                               string suffix) {
  t_type* type = get_true_type(tfield->get_type());

  string name = prefix + tfield->get_name() + suffix;

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name, is_reference(tfield));
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name);
  } else if (type->is_base_type() || type->is_enum()) {

    indent(out) << "xfer += oprot->";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "writeBinary(" << name << ");";
        } else {
          out << "writeString(" << name << ");";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ");";
        break;
      default:
        throw "compiler error: no C++ writer for base type " + t_base_type::t_base_name(tbase)
            + name;
      }
    } else if (type->is_enum()) {
      out << "writeI32(static_cast<int32_t>(" << name << "));";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s' TYPE '%s'\n",
           name.c_str(),
           type_name(type).c_str());
  }
}